

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int send_end_frame(SESSION_INSTANCE *session_instance,ERROR_HANDLE error_handle)

{
  int iVar1;
  END_HANDLE end;
  AMQP_VALUE performative;
  int iVar2;
  
  end = end_create();
  if (end == (END_HANDLE)0x0) {
    return 0x9d;
  }
  if (error_handle != (ERROR_HANDLE)0x0) {
    iVar1 = end_set_error(end,error_handle);
    iVar2 = 0xa4;
    if (iVar1 != 0) goto LAB_0016efc0;
  }
  performative = amqpvalue_create_end(end);
  if (performative == (AMQP_VALUE)0x0) {
    iVar2 = 0xab;
  }
  else {
    iVar1 = connection_encode_frame
                      (session_instance->endpoint,performative,(PAYLOAD *)0x0,0,
                       (ON_SEND_COMPLETE)0x0,(void *)0x0);
    iVar2 = 0xb1;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    amqpvalue_destroy(performative);
  }
LAB_0016efc0:
  end_destroy(end);
  return iVar2;
}

Assistant:

static int send_end_frame(SESSION_INSTANCE* session_instance, ERROR_HANDLE error_handle)
{
    int result;
    END_HANDLE end_performative;

    end_performative = end_create();
    if (end_performative == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        if ((error_handle != NULL) &&
            (end_set_error(end_performative, error_handle) != 0))
        {
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE end_performative_value = amqpvalue_create_end(end_performative);
            if (end_performative_value == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                if (connection_encode_frame(session_instance->endpoint, end_performative_value, NULL, 0, NULL, NULL) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(end_performative_value);
            }
        }

        end_destroy(end_performative);
    }

    return result;
}